

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int exp1(LexState *ls,Fornuminfo *info)

{
  int iVar1;
  undefined4 uVar2;
  expdesc e;
  
  e.usertype = (TString *)0x0;
  e.k = VVOID;
  e._4_4_ = 0;
  e.u.ival = 0;
  e.u.ind.usertype = (TString *)0x0;
  e.t = 0;
  e.f = 0;
  e.ravi_type_map = 0xffffffff;
  e._36_4_ = 0;
  e.pc = -1;
  e._52_4_ = 0;
  iVar1 = (ls->t).token;
  expr(ls,&e);
  if (((byte)ravi_parser_debug & 1) != 0) {
    raviY_printf(ls->fs,"fornum exp -> %e\n",&e);
  }
  info->is_constant = (uint)(e.k == VKINT);
  uVar2 = 0;
  if (e.k == VKINT) {
    uVar2 = e.u.info;
  }
  info->int_value = uVar2;
  luaK_exp2nextreg(ls->fs,&e);
  if (e.k == VNONRELOC) {
    if (e.ravi_type_map != 8 && iVar1 == 0x23) {
      luaK_codeABC(ls->fs,OP_RAVI_TOINT,e.u.info,0,0);
      e.ravi_type_map = 8;
    }
    info->type_map = e.ravi_type_map;
    return e.ravi_type_map;
  }
  __assert_fail("e.k == VNONRELOC",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x80c,"int exp1(LexState *, Fornuminfo *)");
}

Assistant:

static int exp1 (LexState *ls, Fornuminfo *info) {
  /* Since the local variable in a fornum loop is local to the loop and does
   * not use any variable in outer scope we don't need to check its
   * type - also the loop is already optimised so no point trying to
   * optimise the iteration variable
   */
  expdesc e = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int reg;
  int expect_int = 0;
  if (ls->t.token == '#')
    expect_int = 1;
  expr(ls, &e);
  DEBUG_EXPR(raviY_printf(ls->fs, "fornum exp -> %e\n", &e));
  info->is_constant = (e.k == VKINT);
  info->int_value = info->is_constant ? e.u.ival : 0;
  luaK_exp2nextreg(ls->fs, &e);
  lua_assert(e.k == VNONRELOC);
  reg = e.u.info;
  if (expect_int && e.ravi_type_map != RAVI_TM_INTEGER) {
    luaK_codeABC(ls->fs, OP_RAVI_TOINT, reg, 0, 0);
    info->type_map = RAVI_TM_INTEGER;
  }
  else {
    info->type_map = e.ravi_type_map;
  }
  return reg;
}